

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O1

void * __thiscall ChunkedStackPool<4092>::Allocate(ChunkedStackPool<4092> *this,uint bytes)

{
  StackChunk *pSVar1;
  uint uVar2;
  StackChunk *pSVar3;
  uint uVar4;
  
  uVar4 = bytes + 7 & 0xfffffff8;
  if (0xffc < uVar4) {
    __assert_fail("bytes <= chunkSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Pool.h",
                  0x37,"void *ChunkedStackPool<4092>::Allocate(unsigned int) [chunkSize = 4092]");
  }
  uVar2 = this->size + uVar4;
  if (uVar2 < 0xffd) {
    this->size = uVar2;
    pSVar3 = (StackChunk *)((long)this->curr + ((ulong)uVar2 - (ulong)uVar4));
    goto LAB_0012d98d;
  }
  pSVar1 = this->curr;
  if (pSVar1 == (StackChunk *)0x0) {
LAB_0012d96d:
    pSVar3 = (StackChunk *)(*(code *)NULLC::alloc)(0x1008);
    this->first = pSVar3;
LAB_0012d97e:
    this->curr = pSVar3;
    pSVar3->next = (StackChunk *)0x0;
  }
  else {
    pSVar3 = pSVar1->next;
    if (pSVar3 == (StackChunk *)0x0) {
      if (pSVar1 == (StackChunk *)0x0) goto LAB_0012d96d;
      pSVar3 = (StackChunk *)(*(code *)NULLC::alloc)(0x1008);
      this->curr->next = pSVar3;
      goto LAB_0012d97e;
    }
    this->curr = pSVar3;
  }
  this->size = uVar4;
LAB_0012d98d:
  return pSVar3->data;
}

Assistant:

void*	Allocate(unsigned int bytes)
	{
		bytes = (bytes + 7) & ~7; // 8-byte align

		assert(bytes <= chunkSize);
		if(size + bytes <= chunkSize)
		{
			size += bytes;
			return curr->data + size - bytes;
		}
		if(curr && curr->next)
		{
			curr = curr->next;
			size = bytes;
			return curr->data;
		}
		if(curr)
		{
			curr->next = new(NULLC::alloc(sizeof(StackChunk))) StackChunk;
			curr = curr->next;
			curr->next = NULL;
		}else{
			curr = first = new(NULLC::alloc(sizeof(StackChunk))) StackChunk;
			curr->next = NULL;
		}
		size = bytes;
		return curr->data;
	}